

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall
CVmObjLookupTable::make_list
          (CVmObjLookupTable *this,vm_val_t *retval,int store_keys,
          _func_int_vm_val_t_ptr_vm_val_t_ptr *filter)

{
  CVmObjPageEntry *this_00;
  uint *puVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  vm_val_t *pvVar7;
  
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar5 = puVar1[1];
  uVar6 = 0;
  if (uVar5 != 0) {
    pvVar7 = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 8);
    do {
      if (pvVar7->typ != VM_EMPTY) {
        if (filter != (_func_int_vm_val_t_ptr_vm_val_t_ptr *)0x0) {
          iVar2 = (*filter)(pvVar7,pvVar7 + 1);
          if (iVar2 == 0) goto LAB_0026fca2;
        }
        uVar6 = (ulong)((int)uVar6 + 1);
      }
LAB_0026fca2:
      pvVar7 = (vm_val_t *)&pvVar7[2].val;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar6 = (ulong)(int)uVar6;
  }
  vVar3 = CVmObjList::create(0,uVar6);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar3;
  this_00 = G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff);
  uVar6 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
  if (uVar6 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar6 - 1);
  }
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar5 = puVar1[1];
  if (uVar5 != 0) {
    pvVar7 = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 8);
    iVar2 = 0;
    do {
      if (pvVar7->typ != VM_EMPTY) {
        if (filter != (_func_int_vm_val_t_ptr_vm_val_t_ptr *)0x0) {
          iVar4 = (*filter)(pvVar7,pvVar7 + 1);
          if (iVar4 == 0) goto LAB_0026fd51;
        }
        CVmObjList::cons_set_element((CVmObjList *)this_00,(long)iVar2,pvVar7 + (store_keys == 0));
        iVar2 = iVar2 + 1;
      }
LAB_0026fd51:
      pvVar7 = (vm_val_t *)&pvVar7[2].val;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void CVmObjLookupTable::make_list(VMG_ vm_val_t *retval, int store_keys,
                                  int (*filter)(VMG_ const vm_val_t *,
                                                const vm_val_t *))
{
    vm_lookup_val *entry;
    uint i;
    int cnt;
    CVmObjList *lst;

    /* run through the table and count in-use entries */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* skip empties */
        if (entry->key.typ == VM_EMPTY)
            continue;

        /* skip values that the filter function rejects */
        if (filter != 0 && !filter(vmg_ &entry->key, &entry->val))
            continue;

        /* count it */
        ++cnt;
    }

    /* allocate a list to store the results */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));

    /* get the list object */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    lst->cons_clear();

    /* populate the list */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* if the entry is not marked as free, count it as used */
        if (entry->key.typ != VM_EMPTY)
        {
            /* skip values that the filter function rejects */
            if (filter != 0 && !filter(vmg_ &entry->key, &entry->val))
                continue;

            /* store the key or value, as appropriate */
            if (store_keys)
            {
                /* store the key */
                lst->cons_set_element(cnt, &entry->key);
            }
            else
            {
                /* store the value */
                lst->cons_set_element(cnt, &entry->val);
            }

            /* update the destination index */
            ++cnt;
        }
    }
}